

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

int Imf_3_3::pixelTypeSize(PixelType type)

{
  ArgExc *this;
  int in_EDI;
  int size;
  char *in_stack_ffffffffffffffd8;
  int local_8;
  
  if (in_EDI == 0) {
    local_8 = Xdr::size<unsigned_int>();
  }
  else if (in_EDI == 1) {
    local_8 = Xdr::size<Imath_3_1::half>();
  }
  else {
    if (in_EDI != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(this,in_stack_ffffffffffffffd8);
      __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    local_8 = Xdr::size<float>();
  }
  return local_8;
}

Assistant:

int
pixelTypeSize (PixelType type)
{
    int size;

    switch (type)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            size = Xdr::size<unsigned int> ();
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            size = Xdr::size<half> ();
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            size = Xdr::size<float> ();
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel type.");
    }

    return size;
}